

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_CopyConstructor_Test<pica::Particle<(pica::Dimension)3>_>::
~ParticleTest_CopyConstructor_Test
          (ParticleTest_CopyConstructor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  void *in_RDI;
  
  ~ParticleTest_CopyConstructor_Test
            ((ParticleTest_CopyConstructor_Test<pica::Particle<(pica::Dimension)3>_> *)0x1fcbf8);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, CopyConstructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(-134.12, 412.6342, 2346.562);
    MomentumType momentum(-4531.23e5, 6534.123e3, 12.32);
    FactorType factor = 213.51;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle(particle);
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}